

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::number::impl::NumberStringBuilder::prepareForInsertHelper
          (NumberStringBuilder *this,int32_t index,int32_t count,UErrorCode *status)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  char16_t *buffer;
  Field *buffer_00;
  char16_t *buffer_01;
  UNumberFormatFields *buffer_02;
  int32_t newZero_1;
  Field *newFields;
  char16_t *newChars;
  int32_t newZero;
  int32_t newCapacity;
  Field *oldFields;
  char16_t *oldChars;
  int32_t oldZero;
  int32_t oldCapacity;
  UErrorCode *status_local;
  int32_t count_local;
  int32_t index_local;
  NumberStringBuilder *this_local;
  
  iVar2 = getCapacity(this);
  iVar1 = this->fZero;
  buffer = getCharPtr(this);
  buffer_00 = getFieldPtr(this);
  if (iVar2 < this->fLength + count) {
    iVar3 = (this->fLength + count) * 2;
    iVar4 = iVar3 / 2 - (this->fLength + count) / 2;
    buffer_01 = (char16_t *)uprv_malloc_63((long)iVar3 << 1);
    buffer_02 = (UNumberFormatFields *)uprv_malloc_63((long)iVar3 << 2);
    if ((buffer_01 == (char16_t *)0x0) || (buffer_02 == (UNumberFormatFields *)0x0)) {
      uprv_free_63(buffer_01);
      uprv_free_63(buffer_02);
      *status = U_MEMORY_ALLOCATION_ERROR;
      return -1;
    }
    anon_unknown.dwarf_162df5::uprv_memcpy2(buffer_01 + iVar4,buffer + iVar1,(long)index << 1);
    anon_unknown.dwarf_162df5::uprv_memcpy2
              (buffer_01 + (long)iVar4 + (long)index + (long)count,
               buffer + (long)iVar1 + (long)index,(long)(this->fLength - index) << 1);
    anon_unknown.dwarf_162df5::uprv_memcpy2(buffer_02 + iVar4,buffer_00 + iVar1,(long)index << 2);
    anon_unknown.dwarf_162df5::uprv_memcpy2
              (buffer_02 + (long)iVar4 + (long)index + (long)count,
               buffer_00 + (long)iVar1 + (long)index,(long)(this->fLength - index) << 2);
    if ((this->fUsingHeap & 1U) != 0) {
      uprv_free_63(buffer);
      uprv_free_63(buffer_00);
    }
    this->fUsingHeap = true;
    (this->fChars).heap.ptr = buffer_01;
    (this->fChars).heap.capacity = iVar3;
    (this->fFields).heap.ptr = buffer_02;
    (this->fFields).heap.capacity = iVar3;
    this->fZero = iVar4;
    this->fLength = count + this->fLength;
  }
  else {
    iVar3 = iVar2 / 2 - (this->fLength + count) / 2;
    anon_unknown.dwarf_162df5::uprv_memmove2(buffer + iVar3,buffer + iVar1,(long)this->fLength << 1)
    ;
    anon_unknown.dwarf_162df5::uprv_memmove2
              (buffer + (long)iVar3 + (long)index + (long)count,buffer + (long)iVar3 + (long)index,
               (long)(this->fLength - index) << 1);
    anon_unknown.dwarf_162df5::uprv_memmove2
              (buffer_00 + iVar3,buffer_00 + iVar1,(long)this->fLength << 2);
    anon_unknown.dwarf_162df5::uprv_memmove2
              (buffer_00 + (long)iVar3 + (long)index + (long)count,
               buffer_00 + (long)iVar3 + (long)index,(long)(this->fLength - index) << 2);
    this->fZero = iVar3;
    this->fLength = count + this->fLength;
  }
  return this->fZero + index;
}

Assistant:

int32_t NumberStringBuilder::prepareForInsertHelper(int32_t index, int32_t count, UErrorCode &status) {
    int32_t oldCapacity = getCapacity();
    int32_t oldZero = fZero;
    char16_t *oldChars = getCharPtr();
    Field *oldFields = getFieldPtr();
    if (fLength + count > oldCapacity) {
        int32_t newCapacity = (fLength + count) * 2;
        int32_t newZero = newCapacity / 2 - (fLength + count) / 2;

        // C++ note: malloc appears in two places: here and in the assignment operator.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * newCapacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * newCapacity));
        if (newChars == nullptr || newFields == nullptr) {
            uprv_free(newChars);
            uprv_free(newFields);
            status = U_MEMORY_ALLOCATION_ERROR;
            return -1;
        }

        // First copy the prefix and then the suffix, leaving room for the new chars that the
        // caller wants to insert.
        // C++ note: memcpy is OK because the src and dest do not overlap.
        uprv_memcpy2(newChars + newZero, oldChars + oldZero, sizeof(char16_t) * index);
        uprv_memcpy2(newChars + newZero + index + count,
                oldChars + oldZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memcpy2(newFields + newZero, oldFields + oldZero, sizeof(Field) * index);
        uprv_memcpy2(newFields + newZero + index + count,
                oldFields + oldZero + index,
                sizeof(Field) * (fLength - index));

        if (fUsingHeap) {
            uprv_free(oldChars);
            uprv_free(oldFields);
        }
        fUsingHeap = true;
        fChars.heap.ptr = newChars;
        fChars.heap.capacity = newCapacity;
        fFields.heap.ptr = newFields;
        fFields.heap.capacity = newCapacity;
        fZero = newZero;
        fLength += count;
    } else {
        int32_t newZero = oldCapacity / 2 - (fLength + count) / 2;

        // C++ note: memmove is required because src and dest may overlap.
        // First copy the entire string to the location of the prefix, and then move the suffix
        // to make room for the new chars that the caller wants to insert.
        uprv_memmove2(oldChars + newZero, oldChars + oldZero, sizeof(char16_t) * fLength);
        uprv_memmove2(oldChars + newZero + index + count,
                oldChars + newZero + index,
                sizeof(char16_t) * (fLength - index));
        uprv_memmove2(oldFields + newZero, oldFields + oldZero, sizeof(Field) * fLength);
        uprv_memmove2(oldFields + newZero + index + count,
                oldFields + newZero + index,
                sizeof(Field) * (fLength - index));

        fZero = newZero;
        fLength += count;
    }
    return fZero + index;
}